

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O3

void __thiscall FRemapTable::Alloc(FRemapTable *this,int count)

{
  BYTE *pBVar1;
  
  pBVar1 = (BYTE *)M_Malloc_Dbg((long)count * 5,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_data/r_translate.cpp"
                                ,0x70);
  this->Remap = pBVar1;
  if (pBVar1 != (BYTE *)0x0) {
    this->Palette = (PalEntry *)(pBVar1 + count);
    this->Native = (FNativePalette *)0x0;
    this->NumEntries = count;
    return;
  }
  __assert_fail("Remap != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_data/r_translate.cpp"
                ,0x71,"void FRemapTable::Alloc(int)");
}

Assistant:

void FRemapTable::Alloc(int count)
{
	Remap = (BYTE *)M_Malloc(count*sizeof(*Remap) + count*sizeof(*Palette));
	assert (Remap != NULL);
	Palette = (PalEntry *)(Remap + count*(sizeof(*Remap)));
	Native = NULL;
	NumEntries = count;
}